

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmstr.cpp
# Opt level: O3

void find_tag_name(StringRef *tag,char **name,size_t *len,int *is_end_tag)

{
  char cVar1;
  int iVar2;
  char *pcVar3;
  char *pcVar4;
  
  pcVar3 = (char *)((long)&tag[-1].alo + 7);
  do {
    cVar1 = pcVar3[1];
    pcVar3 = pcVar3 + 1;
    iVar2 = isspace((int)cVar1);
  } while (iVar2 != 0);
  *is_end_tag = (uint)(cVar1 == '/');
  if (cVar1 == '/') {
    do {
      pcVar4 = pcVar3 + 1;
      pcVar3 = pcVar3 + 1;
      iVar2 = isspace((int)*pcVar4);
    } while (iVar2 != 0);
  }
  *name = pcVar3;
  cVar1 = *pcVar3;
  pcVar4 = pcVar3;
  while ((cVar1 != '\0' && (iVar2 = isspace((int)cVar1), iVar2 == 0))) {
    cVar1 = pcVar4[1];
    pcVar4 = pcVar4 + 1;
  }
  *len = (long)pcVar4 - (long)pcVar3;
  return;
}

Assistant:

static void find_tag_name(StringRef *tag, const char *&name, size_t &len,
                          int &is_end_tag)
{
    const char *p;

    /* skip leading spaces */
    for (p = tag->get() ; isspace(*p) ; ++p) ;

    /* if it's an end tag, skip the '/' and any intervening spaces */
    if ((is_end_tag = (*p == '/')) != 0)
        for (++p ; isspace(*p) ; ++p) ;

    /* scan the name - it's from here to the next space */
    for (name = p ; *p != '\0' && !isspace(*p) ; ++p) ;

    /* note the length */
    len = p - name;
}